

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_term_indexer.cc
# Opt level: O2

string * __thiscall
S2RegionTermIndexer::GetTerm_abi_cxx11_
          (string *__return_storage_ptr__,S2RegionTermIndexer *this,TermType term_type,S2CellId *id,
          string_view prefix)

{
  AlphaNum *this_00;
  AlphaNum *c;
  string sStack_d8;
  AlphaNum local_b8;
  AlphaNum local_88;
  AlphaNum *local_58;
  size_type local_50;
  
  local_50 = prefix.length_;
  c = (AlphaNum *)prefix.ptr_;
  this_00 = (AlphaNum *)&sStack_d8;
  local_58 = c;
  if (term_type == ANCESTOR) {
    S2CellId::ToToken_abi_cxx11_((string *)&local_b8,id);
    absl::string_view::string_view<std::allocator<char>>
              (&local_88.piece_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8);
    absl::StrCat_abi_cxx11_(__return_storage_ptr__,(absl *)&local_58,&local_88,(AlphaNum *)id);
    this_00 = &local_b8;
  }
  else {
    absl::string_view::string_view<std::allocator<char>>(&local_88.piece_,&(this->options_).marker_)
    ;
    S2CellId::ToToken_abi_cxx11_(&sStack_d8,id);
    absl::string_view::string_view<std::allocator<char>>(&local_b8.piece_,&sStack_d8);
    absl::StrCat_abi_cxx11_(__return_storage_ptr__,(absl *)&local_58,&local_88,&local_b8,c);
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

string S2RegionTermIndexer::GetTerm(TermType term_type, const S2CellId& id,
                                    string_view prefix) const {
  // There are generally more ancestor terms than covering terms, so we add
  // the extra "marker" character to the covering terms to distinguish them.
  if (term_type == TermType::ANCESTOR) {
    return absl::StrCat(prefix, id.ToToken());
  } else {
    return absl::StrCat(prefix, options_.marker(), id.ToToken());
  }
}